

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

int google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
              (UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  LogMessage *other;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  LogFinisher local_71;
  int local_70;
  int local_6c;
  LogMessage local_68;
  
  local_6c = 4;
  lVar9 = 0;
  lVar8 = 0;
  iVar7 = 0;
  while( true ) {
    pvVar1 = unknown_fields->fields_;
    if (pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)(int)((ulong)((long)(pvVar1->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar6 <= lVar8) break;
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(uint *)(&pUVar2->field_0x0 + lVar9);
    if ((uVar4 & 0xe0000000) == 0x60000000) {
      iVar3 = 1;
      if (0x7f < (uVar4 & 0x1fffffff)) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar4 & 0x1fffffff);
        uVar4 = *(uint *)(&pUVar2->field_0x0 + lVar9);
      }
      if ((uVar4 & 0xe0000000) != 0x60000000) {
        local_70 = iVar3;
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/unknown_field_set.h"
                   ,0x130);
        other = LogMessage::operator<<
                          (&local_68,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type_): ");
        LogFinisher::operator=(&local_71,other);
        LogMessage::~LogMessage(&local_68);
        iVar3 = local_70;
      }
      uVar4 = *(uint *)(*(long *)((long)&pUVar2->field_2 + lVar9) + 8);
      iVar5 = 1;
      if (0x7f < uVar4) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar4);
      }
      iVar7 = iVar7 + local_6c + iVar3 + uVar4 + iVar5;
    }
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  return iVar7;
}

Assistant:

int WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  int size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}